

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cram_io.c
# Opt level: O2

cram_slice * cram_read_slice(cram_fd *fd)

{
  uint uVar1;
  int iVar2;
  FILE *__stream;
  cram_block *b;
  cram_slice *s;
  cram_block_slice_hdr *pcVar3;
  cram_block **ppcVar4;
  cram_block *pcVar5;
  cram_block **ppcVar6;
  char *pcVar7;
  int iVar8;
  ulong uVar9;
  int iVar10;
  ulong uVar11;
  
  b = cram_read_block(fd);
  s = (cram_slice *)calloc(1,0x100);
  if (s == (cram_slice *)0x0 || b == (cram_block *)0x0) {
LAB_00122b29:
    if (b == (cram_block *)0x0) goto LAB_00122b3f;
  }
  else {
    s->hdr_block = b;
    __stream = _stderr;
    if ((b->content_type & ~COMPRESSION_HEADER) == MAPPED_SLICE) {
      pcVar3 = cram_decode_slice_header(fd,b);
      s->hdr = pcVar3;
      if (pcVar3 != (cram_block_slice_hdr *)0x0) {
        uVar1 = pcVar3->num_blocks;
        ppcVar4 = (cram_block **)calloc((long)(int)uVar1,8);
        s->block = ppcVar4;
        if (ppcVar4 != (cram_block **)0x0) {
          uVar11 = 0;
          uVar9 = (ulong)uVar1;
          if ((int)uVar1 < 1) {
            uVar9 = uVar11;
          }
          iVar8 = 0x7fffffff;
          iVar10 = 0;
          for (; uVar9 != uVar11; uVar11 = uVar11 + 1) {
            pcVar5 = cram_read_block(fd);
            ppcVar4[uVar11] = pcVar5;
            if (pcVar5 == (cram_block *)0x0) goto LAB_00122b29;
            if (pcVar5->content_type == EXTERNAL) {
              iVar2 = pcVar5->content_id;
              if (iVar10 <= iVar2) {
                iVar10 = iVar2;
              }
              if (iVar2 <= iVar8) {
                iVar8 = iVar2;
              }
            }
          }
          if ((-1 < iVar8) && (iVar10 < 0x400)) {
            ppcVar6 = (cram_block **)calloc(0x400,8);
            s->block_by_id = ppcVar6;
            if (ppcVar6 == (cram_block **)0x0) goto LAB_00122b29;
            for (uVar11 = 0; uVar9 != uVar11; uVar11 = uVar11 + 1) {
              pcVar5 = ppcVar4[uVar11];
              if (pcVar5->content_type == EXTERNAL) {
                ppcVar6[pcVar5->content_id] = pcVar5;
              }
            }
          }
          pcVar5 = cram_new_block(EXTERNAL,0);
          s->seqs_blk = pcVar5;
          if (pcVar5 != (cram_block *)0x0) {
            pcVar5 = cram_new_block(EXTERNAL,0xc);
            s->qual_blk = pcVar5;
            if (pcVar5 != (cram_block *)0x0) {
              pcVar5 = cram_new_block(EXTERNAL,0xb);
              s->name_blk = pcVar5;
              if (pcVar5 != (cram_block *)0x0) {
                pcVar5 = cram_new_block(EXTERNAL,1);
                s->aux_blk = pcVar5;
                if (pcVar5 != (cram_block *)0x0) {
                  pcVar5 = cram_new_block(EXTERNAL,0xd);
                  s->base_blk = pcVar5;
                  if (pcVar5 != (cram_block *)0x0) {
                    pcVar5 = cram_new_block(EXTERNAL,0xe);
                    s->soft_blk = pcVar5;
                    if (pcVar5 != (cram_block *)0x0) {
                      s->last_apos = pcVar3->ref_seq_start;
                      return s;
                    }
                  }
                }
              }
            }
          }
          goto LAB_00122b29;
        }
      }
    }
    else {
      pcVar7 = cram_content_type2str(b->content_type);
      fprintf(__stream,"Unexpected block of type %s\n",pcVar7);
    }
  }
  cram_free_block(b);
LAB_00122b3f:
  if (s != (cram_slice *)0x0) {
    s->hdr_block = (cram_block *)0x0;
    cram_free_slice(s);
  }
  return (cram_slice *)0x0;
}

Assistant:

cram_slice *cram_read_slice(cram_fd *fd) {
    cram_block *b = cram_read_block(fd);
    cram_slice *s = calloc(1, sizeof(*s));
    int i, n, max_id, min_id;

    if (!b || !s)
	goto err;

    s->hdr_block = b;
    switch (b->content_type) {
    case MAPPED_SLICE:
    case UNMAPPED_SLICE:
	if (!(s->hdr = cram_decode_slice_header(fd, b)))
	    goto err;
	break;

    default:
	fprintf(stderr, "Unexpected block of type %s\n",
		cram_content_type2str(b->content_type));
	goto err;
    }

    s->block = calloc(n = s->hdr->num_blocks, sizeof(*s->block));
    if (!s->block)
	goto err;

    for (max_id = i = 0, min_id = INT_MAX; i < n; i++) {
	if (!(s->block[i] = cram_read_block(fd)))
	    goto err;

	if (s->block[i]->content_type == EXTERNAL) {
	    if (max_id < s->block[i]->content_id)
		max_id = s->block[i]->content_id;
	    if (min_id > s->block[i]->content_id)
		min_id = s->block[i]->content_id;
	}
    }
    if (min_id >= 0 && max_id < 1024) {
	if (!(s->block_by_id = calloc(1024, sizeof(s->block[0]))))
	    goto err;

	for (i = 0; i < n; i++) {
	    if (s->block[i]->content_type != EXTERNAL)
		continue;
	    s->block_by_id[s->block[i]->content_id] = s->block[i];
	}
    }

    /* Initialise encoding/decoding tables */
    s->cigar = NULL;
    s->cigar_alloc = 0;
    s->ncigar = 0;

    if (!(s->seqs_blk = cram_new_block(EXTERNAL, 0)))      goto err;
    if (!(s->qual_blk = cram_new_block(EXTERNAL, DS_QS)))  goto err;
    if (!(s->name_blk = cram_new_block(EXTERNAL, DS_RN)))  goto err;
    if (!(s->aux_blk  = cram_new_block(EXTERNAL, DS_aux))) goto err;
    if (!(s->base_blk = cram_new_block(EXTERNAL, DS_IN)))  goto err;
    if (!(s->soft_blk = cram_new_block(EXTERNAL, DS_SC)))  goto err;

    s->crecs = NULL;

    s->last_apos = s->hdr->ref_seq_start;
    
    return s;

 err:
    if (b)
	cram_free_block(b);
    if (s) {
	s->hdr_block = NULL;
	cram_free_slice(s);
    }
    return NULL;
}